

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result __thiscall
testing::Action<void_(unsigned_short,_unsigned_short)>::Perform
          (Action<void_(unsigned_short,_unsigned_short)> *this,ArgumentTuple *args)

{
  ActionInterface<void_(unsigned_short,_unsigned_short)> *pAVar1;
  _Manager_type p_Var2;
  
  p_Var2 = (this->fun_).super__Function_base._M_manager;
  if ((this->impl_).value_ == (ActionInterface<void_(unsigned_short,_unsigned_short)> *)0x0 &&
      p_Var2 == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O2/_deps/googletest-src/googlemock/include/gmock/gmock-actions.h"
               ,0x193);
    p_Var2 = (this->fun_).super__Function_base._M_manager;
  }
  if (p_Var2 != (_Manager_type)0x0) {
    internal::
    ApplyImpl<std::function<void(unsigned_short,unsigned_short)>const&,std::tuple<unsigned_short,unsigned_short>,0ul,1ul>
              (this,args);
    return;
  }
  pAVar1 = (this->impl_).value_;
  (**(code **)(*(long *)pAVar1 + 0x10))(pAVar1,args);
  return;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
#if GTEST_LANG_CXX11
    if (fun_ != nullptr) {
      return internal::Apply(fun_, ::std::move(args));
    }
#endif
    return impl_->Perform(args);
  }